

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O3

Span * __thiscall tcmalloc::PageHeap::SearchSmallAndLarge(PageHeap *this,uint64_t n)

{
  bool bVar1;
  Span *pSVar2;
  long lVar3;
  
  if (n < 0x80) {
    lVar3 = n - 0x80;
    pSVar2 = this->small_returned_ + n;
    do {
      if (pSVar2 + -0x80 != pSVar2[-0x80].prev) {
        pSVar2 = pSVar2[-0x80].next;
        RemoveFromFreeList(this,pSVar2);
        bVar1 = CheckSmallList(this);
        if (bVar1) {
          return pSVar2;
        }
        __assert_fail("CheckSmallList()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0xa7,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
      }
      if (pSVar2 != pSVar2->prev) {
        pSVar2 = pSVar2->next;
        RemoveFromFreeList(this,pSVar2);
        bVar1 = CheckSmallList(this);
        if (bVar1) {
          return pSVar2;
        }
        __assert_fail("CheckSmallList()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0xae,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
      }
      pSVar2 = pSVar2 + 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  pSVar2 = AllocLarge(this,n);
  return pSVar2;
}

Assistant:

Span* SearchSmallAndLarge(uint64_t n) {
        Span* span = nullptr;
        for (uint64_t i = n; i <= spanSmallPages; ++i) {
            if (!ListEmpty(&small_normal_[i])) {
                span = small_normal_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }

            if (!ListEmpty(&small_returned_[i])) {
                span = small_returned_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }
        }
        return AllocLarge(n);
    }